

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderModule.cpp
# Opt level: O0

Ptr<ShaderModule> myvk::ShaderModule::Create(Ptr<Device> *device,uint32_t *code,uint32_t code_size)

{
  PFN_vkCreateShaderModule p_Var1;
  VkResult VVar2;
  element_type *this;
  VkDevice pVVar3;
  element_type *peVar4;
  uint in_ECX;
  uint32_t *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Ptr<ShaderModule> PVar5;
  VkShaderModuleCreateInfo info;
  shared_ptr<myvk::ShaderModule> ret;
  shared_ptr<myvk::Device> *in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  VkShaderModuleCreateInfo local_58;
  uint local_1c;
  uint32_t *local_18;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  std::make_shared<myvk::ShaderModule>();
  std::__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2d93a9);
  std::shared_ptr<myvk::Device>::operator=
            ((shared_ptr<myvk::Device> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58
            );
  p_Var1 = vkCreateShaderModule;
  local_58.flags = 0;
  local_58._20_4_ = 0;
  local_58.pNext = (void *)0x0;
  local_58.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
  local_58._4_4_ = 0;
  local_58.pCode = local_18;
  local_58.codeSize = (size_t)local_1c;
  this = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    0x2d940d);
  pVVar3 = Device::GetHandle(this);
  peVar4 = std::__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2d9426);
  VVar2 = (*p_Var1)(pVVar3,&local_58,(VkAllocationCallbacks *)0x0,&peVar4->m_shader_module);
  if (VVar2 == VK_SUCCESS) {
    std::shared_ptr<myvk::ShaderModule>::shared_ptr
              ((shared_ptr<myvk::ShaderModule> *)(ulong)in_stack_ffffffffffffff60,
               (shared_ptr<myvk::ShaderModule> *)in_stack_ffffffffffffff58);
  }
  else {
    std::shared_ptr<myvk::ShaderModule>::shared_ptr
              ((shared_ptr<myvk::ShaderModule> *)CONCAT44(VVar2,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
  }
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x2d94a2);
  PVar5.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar5.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<ShaderModule>)PVar5.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Ptr<ShaderModule> ShaderModule::Create(const Ptr<Device> &device, const uint32_t *code, uint32_t code_size) {
	auto ret = std::make_shared<ShaderModule>();
	ret->m_device_ptr = device;

	VkShaderModuleCreateInfo info = {};
	info.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
	info.pCode = code;
	info.codeSize = code_size;
	if (vkCreateShaderModule(device->GetHandle(), &info, nullptr, &ret->m_shader_module) != VK_SUCCESS)
		return nullptr;
	return ret;
}